

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

int text_sortcompare(void *z1,void *z2,void *zkeyinfo)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint *puVar7;
  
  puVar6 = *z1;
  puVar7 = *z2;
  iVar3 = *(int *)((long)zkeyinfo + 4);
  iVar5 = iVar3;
  if (iVar3 != 0) {
    do {
      if ((*puVar6 & 0xfffffffe) == 4) goto LAB_0018e13e;
      puVar6 = puVar6 + 4;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
      if ((*puVar7 & 0xfffffffe) == 4) goto LAB_0018e162;
      puVar7 = puVar7 + 4;
    }
  }
  uVar4 = *puVar6;
  while ((uVar4 & 0xfffffffe) != 4) {
    uVar2 = *puVar7;
    if ((uVar2 & 0xfffffffe) == 4) {
LAB_0018e168:
      return *zkeyinfo;
    }
    if (uVar4 == 2) {
      if (uVar2 != 2) goto LAB_0018e168;
      iVar3 = strcmp((char *)**(undefined8 **)(puVar6 + 2),(char *)**(undefined8 **)(puVar7 + 2));
      if (iVar3 != 0) {
        return iVar3 * *zkeyinfo;
      }
    }
    else if (uVar4 == 1) {
      if (uVar2 != 1) goto LAB_0018e162;
      if ((float)puVar6[2] < (float)puVar7[2]) goto LAB_0018e162;
      if ((float)puVar7[2] < (float)puVar6[2]) goto LAB_0018e168;
    }
    puVar7 = puVar7 + 4;
    puVar1 = puVar6 + 4;
    puVar6 = puVar6 + 4;
    uVar4 = *puVar1;
  }
  if ((*puVar7 & 0xfffffffe) == 4) {
LAB_0018e156:
    return -(uint)(puVar6 < puVar7) | 1;
  }
LAB_0018e162:
  return -*zkeyinfo;
  while( true ) {
    puVar7 = puVar7 + 4;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) break;
LAB_0018e13e:
    if ((*puVar7 & 0xfffffffe) == 4) goto LAB_0018e156;
  }
  goto LAB_0018e162;
}

Assistant:

static int text_sortcompare(const void *z1, const void *z2, void *zkeyinfo)
#endif
{
    const t_atom *a1 = *(t_atom **)z1, *a2 = *(t_atom **)z2;
    t_keyinfo *k = (t_keyinfo *)zkeyinfo;
    int count;
        /* advance first line by key onset and react if we run out early */
    for (count = k->ki_onset; count--; a1++)
    {
        if (a1->a_type == A_SEMI || a1->a_type == A_COMMA)
        {
                /* if second line runs out early too consider them equal */
            for (count = k->ki_onset; count--; a2++)
                if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
                    goto equal;
            return (-k->ki_forward);
        }
    }
    for (count = k->ki_onset; count--; a2++)
        if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
            return (-k->ki_forward);
        /* compare remaining fields */
    for (; ; a1++, a2++)
    {
        if (a1->a_type == A_SEMI || a1->a_type == A_COMMA)
        {
                /* hit end of first line */
            if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
                 goto equal;
            else return (-k->ki_forward);
        }
        else if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
            return (k->ki_forward); /* hit end of second line */

            /* otherwise if they're different return something, and
            if not proceed to next field */
        else if (a1->a_type == A_FLOAT)
        {
            if (a2->a_type == A_FLOAT)
            {
                if (a1->a_w.w_float < a2->a_w.w_float)
                    return (-k->ki_forward);
                else if (a1->a_w.w_float > a2->a_w.w_float)
                    return (k->ki_forward);
            }
            else return (-k->ki_forward);
        }
        else if (a1->a_type == A_SYMBOL)
        {
            if (a2->a_type == A_SYMBOL)
            {
                int z = strcmp(a1->a_w.w_symbol->s_name,
                    a2->a_w.w_symbol->s_name);
                if (z)
                    return (z * k->ki_forward);
            }
            else return (k->ki_forward);
        }
    }
equal:
    /* ran out of both lines at same time, so we're "equal".
    in this case compare pointers so that "equal" lines (which
    might not be identical because of a nonzero onset) stay in the
    same order as before. */
    if (a1 < a2)
        return (-1);
    else return (1);
}